

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O3

idx_t duckdb::TemplatedMatch<false,duckdb::uhugeint_t,duckdb::NotDistinctFrom>
                (Vector *param_1,TupleDataVectorFormat *lhs_format,SelectionVector *sel,idx_t count,
                TupleDataLayout *rhs_layout,Vector *rhs_row_locations,idx_t col_idx,
                vector<duckdb::MatchFunction,_true> *param_8,SelectionVector *no_match_sel,
                idx_t *no_match_count)

{
  uint64_t *puVar1;
  data_ptr_t pdVar2;
  SelectionVector *pSVar3;
  value_type vVar4;
  sel_t *psVar5;
  unsigned_long *puVar6;
  data_ptr_t pdVar7;
  const_reference pvVar8;
  sel_t *psVar9;
  uint uVar10;
  idx_t iVar11;
  idx_t iVar12;
  idx_t iVar13;
  idx_t iVar14;
  bool bVar15;
  uhugeint_t local_48;
  data_ptr_t local_38;
  
  if ((lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    pSVar3 = (lhs_format->unified).sel;
    pdVar2 = (lhs_format->unified).data;
    pdVar7 = rhs_row_locations->data;
    pvVar8 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
    if (count != 0) {
      vVar4 = *pvVar8;
      iVar14 = 0;
      iVar12 = 0;
      do {
        iVar11 = iVar12;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar11 = (idx_t)sel->sel_vector[iVar12];
        }
        psVar9 = pSVar3->sel_vector;
        iVar13 = iVar11;
        if (psVar9 != (sel_t *)0x0) {
          iVar13 = (idx_t)psVar9[iVar11];
        }
        puVar1 = (uint64_t *)(*(long *)(pdVar7 + iVar11 * 8) + vVar4);
        local_48.lower = *puVar1;
        local_48.upper = puVar1[1];
        if (((1 << ((byte)col_idx & 7) &
             (uint)*(byte *)(*(long *)(pdVar7 + iVar11 * 8) + (col_idx >> 3))) != 0) &&
           (bVar15 = uhugeint_t::operator==((uhugeint_t *)(pdVar2 + iVar13 * 0x10),&local_48),
           bVar15)) {
          sel->sel_vector[iVar14] = (sel_t)iVar11;
          iVar14 = iVar14 + 1;
        }
        iVar12 = iVar12 + 1;
      } while (count != iVar12);
      return iVar14;
    }
  }
  else {
    pdVar2 = rhs_row_locations->data;
    pSVar3 = (lhs_format->unified).sel;
    local_38 = (lhs_format->unified).data;
    pvVar8 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
    if (count != 0) {
      vVar4 = *pvVar8;
      iVar14 = 0;
      iVar12 = 0;
      do {
        psVar9 = sel->sel_vector;
        iVar11 = iVar12;
        if (psVar9 != (sel_t *)0x0) {
          iVar11 = (idx_t)psVar9[iVar12];
        }
        psVar5 = pSVar3->sel_vector;
        iVar13 = iVar11;
        if (psVar5 != (sel_t *)0x0) {
          iVar13 = (idx_t)psVar5[iVar11];
        }
        puVar6 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.
                 validity_mask;
        if (puVar6 == (unsigned_long *)0x0) {
          bVar15 = false;
        }
        else {
          bVar15 = (puVar6[iVar13 >> 6] >> (iVar13 & 0x3f) & 1) == 0;
        }
        uVar10 = (uint)*(byte *)(*(long *)(pdVar2 + iVar11 * 8) + (col_idx >> 3)) &
                 1 << ((byte)col_idx & 7);
        puVar1 = (uint64_t *)(*(long *)(pdVar2 + iVar11 * 8) + vVar4);
        local_48.lower = *puVar1;
        local_48.upper = puVar1[1];
        if ((bVar15 == false) && (uVar10 != 0)) {
          bVar15 = uhugeint_t::operator==((uhugeint_t *)(local_38 + iVar13 * 0x10),&local_48);
          if (bVar15) {
            psVar9 = sel->sel_vector;
LAB_0129ed11:
            psVar9[iVar14] = (sel_t)iVar11;
            iVar14 = iVar14 + 1;
          }
        }
        else if (bVar15 == (uVar10 == 0)) goto LAB_0129ed11;
        iVar12 = iVar12 + 1;
        if (count == iVar12) {
          return iVar14;
        }
      } while( true );
    }
  }
  return 0;
}

Assistant:

static idx_t TemplatedMatch(Vector &, const TupleDataVectorFormat &lhs_format, SelectionVector &sel, const idx_t count,
                            const TupleDataLayout &rhs_layout, Vector &rhs_row_locations, const idx_t col_idx,
                            const vector<MatchFunction> &, SelectionVector *no_match_sel, idx_t &no_match_count) {
	if (lhs_format.unified.validity.AllValid()) {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, true>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                     col_idx, no_match_sel, no_match_count);
	} else {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, false>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                      col_idx, no_match_sel, no_match_count);
	}
}